

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall
ImGuiMenuColumns::Update(ImGuiMenuColumns *this,float spacing,bool window_reappearing)

{
  byte in_SIL;
  ImGuiMenuColumns *in_RDI;
  float in_XMM0_Da;
  
  if ((in_SIL & 1) != 0) {
    memset(in_RDI->Widths,0,8);
  }
  in_RDI->Spacing = (ImU16)(int)in_XMM0_Da;
  CalcNextTotalWidth(in_RDI,true);
  memset(in_RDI->Widths,0,8);
  in_RDI->TotalWidth = in_RDI->NextTotalWidth;
  in_RDI->NextTotalWidth = 0;
  return;
}

Assistant:

void ImGuiMenuColumns::Update(float spacing, bool window_reappearing)
{
    if (window_reappearing)
        memset(Widths, 0, sizeof(Widths));
    Spacing = (ImU16)spacing;
    CalcNextTotalWidth(true);
    memset(Widths, 0, sizeof(Widths));
    TotalWidth = NextTotalWidth;
    NextTotalWidth = 0;
}